

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O1

size_t really_read(int sock,void *in,size_t count)

{
  uint uVar1;
  ssize_t sVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  vw_exception *this;
  size_t sVar7;
  char *__buf;
  stringstream __msg;
  char __errmsg [256];
  string local_2d0;
  stringstream local_2b0 [16];
  ostream local_2a0;
  char local_128 [256];
  
  if (count == 0) {
LAB_00227103:
    sVar7 = 0;
  }
  else {
    sVar7 = 0;
    do {
      sVar2 = read(sock,in,(ulong)(uint)((int)count - (int)sVar7));
      uVar1 = (uint)sVar2;
      if (uVar1 == 0) goto LAB_00227103;
      if ((int)uVar1 < 0) {
        std::__cxx11::stringstream::stringstream(local_2b0);
        std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,"read(",5);
        poVar3 = (ostream *)std::ostream::operator<<(&local_2a0,sock);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-",1);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
        piVar4 = __errno_location();
        __buf = local_128;
        pcVar5 = strerror_r(*piVar4,__buf,0x100);
        if (pcVar5 == (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,"errno = ",8);
          sVar6 = strlen(__buf);
        }
        else {
          sVar6 = 0xf;
          __buf = "errno = unknown";
        }
        std::__ostream_insert<char,std::char_traits<char>>(&local_2a0,__buf,sVar6);
        this = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (this,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/global_data.cc"
                   ,0x2b,&local_2d0);
        __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      sVar7 = sVar7 + (uVar1 & 0x7fffffff);
      in = (void *)((long)in + (ulong)(uVar1 & 0x7fffffff));
    } while (sVar7 < count);
  }
  return sVar7;
}

Assistant:

size_t really_read(int sock, void* in, size_t count)
{
  char* buf = (char*)in;
  size_t done = 0;
  int r = 0;
  while (done < count)
  {
    if ((r =
#ifdef _WIN32
                recv(sock, buf, (unsigned int)(count - done), 0)
#else
                read(sock, buf, (unsigned int)(count - done))
#endif
                ) == 0)
      return 0;
    else if (r < 0)
    {
      THROWERRNO("read(" << sock << "," << count << "-" << done << ")");
    }
    else
    {
      done += r;
      buf += r;
    }
  }
  return done;
}